

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::OpenCompactionOutputFile(DBImpl *this,CompactionState *compact)

{
  bool bVar1;
  uint64_t uVar2;
  void *pvVar3;
  long in_RDX;
  Options *in_RSI;
  WritableFile *in_RDI;
  long in_FS_OFFSET;
  Status *s;
  uint64_t file_number;
  string fname;
  Output out;
  VersionSet *in_stack_ffffffffffffff08;
  value_type *in_stack_ffffffffffffff10;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Output *in_stack_ffffffffffffff28;
  undefined1 *puVar4;
  WritableFile *file;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 local_78 [32];
  uint64_t local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x31d,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    file = in_RDI;
    port::Mutex::Lock((Mutex *)in_stack_ffffffffffffff08);
    uVar2 = VersionSet::NewFileNumber(in_stack_ffffffffffffff08);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              (in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->number);
    CompactionState::Output::Output(in_stack_ffffffffffffff28);
    local_58 = uVar2;
    InternalKey::Clear((InternalKey *)in_stack_ffffffffffffff08);
    InternalKey::Clear((InternalKey *)in_stack_ffffffffffffff08);
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::push_back((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffff08);
    CompactionState::Output::~Output((Output *)in_stack_ffffffffffffff08);
    puVar4 = local_78;
    TableFileName((string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                  (uint64_t)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 & 0xffffff;
    (**(code **)(**(long **)&in_RSI->create_if_missing + 0x20))
              (in_RDI,*(long **)&in_RSI->create_if_missing,puVar4,in_RDX + 0x28);
    bVar1 = Status::ok((Status *)in_stack_ffffffffffffff08);
    if (bVar1) {
      pvVar3 = operator_new(8);
      TableBuilder::TableBuilder
                ((TableBuilder *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_RSI,file);
      *(void **)(in_RDX + 0x30) = pvVar3;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff08);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (Status)(char *)file;
    }
    __stack_chk_fail();
  }
  __assert_fail("compact->builder == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                ,0x31e,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
}

Assistant:

Status DBImpl::OpenCompactionOutputFile(CompactionState* compact) {
  assert(compact != nullptr);
  assert(compact->builder == nullptr);
  uint64_t file_number;
  {
    mutex_.Lock();
    file_number = versions_->NewFileNumber();
    pending_outputs_.insert(file_number);
    CompactionState::Output out;
    out.number = file_number;
    out.smallest.Clear();
    out.largest.Clear();
    compact->outputs.push_back(out);
    mutex_.Unlock();
  }

  // Make the output file
  std::string fname = TableFileName(dbname_, file_number);
  Status s = env_->NewWritableFile(fname, &compact->outfile);
  if (s.ok()) {
    compact->builder = new TableBuilder(options_, compact->outfile);
  }
  return s;
}